

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arithmetic.cpp
# Opt level: O1

bool duckdb::MultiplyPropagateStatistics::Operation<int,duckdb::TryMultiplyOperator>
               (LogicalType *type,BaseStatistics *lstats,BaseStatistics *rstats,Value *new_min,
               Value *new_max)

{
  bool bVar1;
  uint uVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  BaseStatistics *pBVar7;
  uint uVar8;
  BaseStatistics *pBVar9;
  long lVar10;
  ulong uVar11;
  ulong uVar12;
  BaseStatistics *pBVar13;
  BaseStatistics *pBVar14;
  BaseStatistics *pBVar15;
  bool bVar16;
  int lvals [2];
  int local_80 [2];
  Value *local_78;
  Value local_70;
  
  local_78 = new_max;
  local_80[0] = NumericStats::GetMin<int>(lstats);
  local_80[1] = NumericStats::GetMax<int>(lstats);
  iVar4 = NumericStats::GetMin<int>(rstats);
  iVar5 = NumericStats::GetMax<int>(rstats);
  uVar6 = 0x7fffffff;
  uVar8 = 0x80000000;
  bVar16 = true;
  lVar10 = 0;
  do {
    pBVar13 = (BaseStatistics *)((long)iVar4 * (long)local_80[lVar10]);
    pBVar14 = (BaseStatistics *)(long)(int)pBVar13;
    pBVar15 = pBVar13;
    if (pBVar14 != pBVar13) {
      pBVar15 = rstats;
    }
    rstats = (BaseStatistics *)((ulong)pBVar15 & 0xffffffff);
    pBVar7 = (BaseStatistics *)(ulong)uVar6;
    if ((int)pBVar15 < (int)uVar6) {
      pBVar7 = rstats;
    }
    pBVar9 = (BaseStatistics *)(ulong)uVar8;
    if ((int)uVar8 < (int)pBVar15) {
      pBVar9 = rstats;
    }
    uVar2 = (uint)pBVar7;
    if (pBVar14 != pBVar13) {
      pBVar7 = (BaseStatistics *)(ulong)uVar6;
      uVar2 = uVar6;
    }
    uVar6 = uVar2;
    if (pBVar14 != pBVar13) {
      bVar1 = false;
    }
    else {
      uVar11 = (long)local_80[lVar10] * (long)iVar5;
      uVar12 = uVar11 + 0x80000000 >> 0x20;
      uVar2 = (uint)pBVar9;
      bVar3 = false;
      do {
        bVar1 = bVar3;
        uVar8 = uVar2;
        if (bVar1) break;
        if (uVar12 == 0) {
          rstats = (BaseStatistics *)(uVar11 & 0xffffffff);
        }
        pBVar15 = (BaseStatistics *)(ulong)uVar6;
        if ((int)rstats < (int)uVar6) {
          pBVar15 = rstats;
        }
        pBVar13 = (BaseStatistics *)(ulong)uVar8;
        if ((int)uVar8 < (int)rstats) {
          pBVar13 = rstats;
        }
        uVar6 = (uint)pBVar7;
        if (uVar12 == 0) {
          pBVar7 = pBVar15;
          uVar6 = (uint)pBVar15;
        }
        uVar8 = (uint)pBVar9;
        pBVar9 = pBVar13;
        uVar2 = (uint)pBVar13;
        bVar3 = true;
      } while (uVar12 == 0);
    }
    if (!bVar1) break;
    bVar16 = lVar10 == 0;
    lVar10 = lVar10 + 1;
  } while (bVar16);
  if (bVar16 == false) {
    Value::Numeric(&local_70,type,(long)(int)uVar6);
    Value::operator=(new_min,&local_70);
    Value::~Value(&local_70);
    Value::Numeric(&local_70,type,(long)(int)uVar8);
    Value::operator=(local_78,&local_70);
    Value::~Value(&local_70);
  }
  return bVar16;
}

Assistant:

static bool Operation(const LogicalType &type, BaseStatistics &lstats, BaseStatistics &rstats, Value &new_min,
	                      Value &new_max) {
		// statistics propagation on the multiplication is slightly less straightforward because of negative numbers
		// the new min/max depend on the signs of the input types
		// if both are positive the result is [lmin * rmin][lmax * rmax]
		// if lmin/lmax are negative the result is [lmin * rmax][lmax * rmin]
		// etc
		// rather than doing all this switcheroo we just multiply all combinations of lmin/lmax with rmin/rmax
		// and check what the minimum/maximum value is
		T lvals[] {NumericStats::GetMin<T>(lstats), NumericStats::GetMax<T>(lstats)};
		T rvals[] {NumericStats::GetMin<T>(rstats), NumericStats::GetMax<T>(rstats)};
		T min = NumericLimits<T>::Maximum();
		T max = NumericLimits<T>::Minimum();
		// multiplications
		for (idx_t l = 0; l < 2; l++) {
			for (idx_t r = 0; r < 2; r++) {
				T result;
				if (!OP::Operation(lvals[l], rvals[r], result)) {
					// potential overflow
					return true;
				}
				if (result < min) {
					min = result;
				}
				if (result > max) {
					max = result;
				}
			}
		}
		new_min = Value::Numeric(type, min);
		new_max = Value::Numeric(type, max);
		return false;
	}